

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O1

bool __thiscall
stk::FileRead::getRawInfo
          (FileRead *this,char *fileName,uint nChannels,StkFormat format,StkFloat rate)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  stat filestat;
  stat local_b0;
  
  iVar1 = stat(fileName,&local_b0);
  if (iVar1 == -1) {
    pcVar5 = "FileRead: Could not stat RAW file (";
    lVar4 = 0x23;
  }
  else {
    if (nChannels != 0) {
      this->dataOffset_ = 0;
      this->channels_ = nChannels;
      this->dataType_ = format;
      this->fileRate_ = rate;
      lVar4 = 1;
      if ((((format == 1) || (lVar4 = 2, format == 2)) || (lVar4 = 4, format == 8)) ||
         ((format == 0x10 || (lVar4 = 8, format == 0x20)))) {
        this->fileSize_ = (local_b0.st_size / lVar4) / (long)(ulong)nChannels;
        this->byteswap_ = true;
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead: StkFormat ",0x14);
      poVar2 = std::ostream::_M_insert<unsigned_long>(0x1173a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," is invalid (",0xd);
      if (fileName == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(fileName);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,fileName,sVar3);
      }
      goto LAB_0010ccb1;
    }
    pcVar5 = "FileRead: number of channels can\'t be 0 (";
    lVar4 = 0x29;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&Stk::oStream__abi_cxx11_,pcVar5,lVar4);
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(Stk::oStream__abi_cxx11_ + -0x18) + 0x1173a0);
  }
  else {
    sVar3 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,fileName,sVar3);
  }
  poVar2 = (ostream *)&Stk::oStream__abi_cxx11_;
LAB_0010ccb1:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,").",2);
  return false;
}

Assistant:

bool FileRead :: getRawInfo( const char *fileName, unsigned int nChannels, StkFormat format, StkFloat rate )
{
  // Use the system call "stat" to determine the file length.
  struct stat filestat;
  if ( stat(fileName, &filestat) == -1 ) {
    oStream_ << "FileRead: Could not stat RAW file (" << fileName << ").";
    return false;
  }
  if ( nChannels == 0 ) {
    oStream_ << "FileRead: number of channels can't be 0 (" << fileName << ").";
    return false;
  }

  // Rawwave files have no header and by default, are assumed to
  // contain a monophonic stream of 16-bit signed integers in
  // big-endian byte order at a sample rate of 22050 Hz.  However,
  // different parameters can be specified if desired.
  dataOffset_ = 0;
  channels_ = nChannels;
  dataType_ = format;
  fileRate_ = rate;
  int sampleBytes = 0;
  if ( format == STK_SINT8 ) sampleBytes = 1;
  else if ( format == STK_SINT16 ) sampleBytes = 2;
  else if ( format == STK_SINT32 || format == STK_FLOAT32 ) sampleBytes = 4;
  else if ( format == STK_FLOAT64 ) sampleBytes = 8;
  else {
    oStream_ << "FileRead: StkFormat " << format << " is invalid (" << fileName << ").";
    return false;
  }

  fileSize_ = (long) filestat.st_size / sampleBytes / channels_;  // length in frames

  byteswap_ = false;
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
#endif

  return true;
}